

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framebuffer.hpp
# Opt level: O1

bool __thiscall qe::Framebuffer::valid(Framebuffer *this)

{
  GLenum GVar1;
  GLenum GVar2;
  ostream *poVar3;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  string local_38;
  
  bind(this,in_ESI,in_RDX,in_ECX);
  GVar1 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar1 == 0x8cd5) {
    (*glad_glBindFramebuffer)(0x8d40,0);
  }
  else {
    GVar2 = (*glad_glCheckFramebufferStatus)(0x8d40);
    if ((int)GVar2 < 0x8cdc) {
      if (GVar2 == 0x8cd6) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"GERROR ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"FBO.valid: Incomplete Attachment",0x20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," (",2);
        cut_abi_cxx11_(&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                      );
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_38._M_dataplus._M_p,
                            local_38._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      else {
        if (GVar2 != 0x8cd7) goto LAB_0015dda4;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"GERROR ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"FBO.valid: No Attachments",0x19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," (",2);
        cut_abi_cxx11_(&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                      );
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_38._M_dataplus._M_p,
                            local_38._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
    }
    else if (GVar2 == 0x8cdc) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"GERROR ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"FBO.valid: Invalid readBuffer",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," (",2);
      cut_abi_cxx11_(&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    else if (GVar2 == 0x8d56) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"GERROR ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"FBO.valid: Incomplete Multisample",0x21);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," (",2);
      cut_abi_cxx11_(&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x53);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    else {
      if (GVar2 != 0x8da8) goto LAB_0015dda4;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"GERROR ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"FBO.valid: Incomplete Layer Targets",0x23);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," (",2);
      cut_abi_cxx11_(&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x56);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0015dda4:
  return GVar1 == 0x8cd5;
}

Assistant:

bool valid() {
            bind();
            if(glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
                switch(glCheckFramebufferStatus(GL_FRAMEBUFFER)) {
                case GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT:
                    GERR("FBO.valid: Incomplete Attachment");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT:
                    GERR("FBO.valid: No Attachments");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER:
                    GERR("FBO.valid: Invalid readBuffer");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE:
                    GERR("FBO.valid: Incomplete Multisample");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS:
                    GERR("FBO.valid: Incomplete Layer Targets");
                    break;
                }
                return false;
            }
            unbind();
            return true;
        }